

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O1

int archive_write_v7tar_header(archive_write *a,archive_entry *entry)

{
  la_int64_t *plVar1;
  size_t sVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  mode_t mVar5;
  wchar_t wVar6;
  int iVar7;
  archive_string_conv *paVar8;
  char *pcVar9;
  size_t sVar10;
  archive_string *paVar11;
  int *piVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined4 *puVar17;
  la_int64_t lVar18;
  undefined8 *puVar19;
  uint uVar20;
  uint uVar21;
  undefined1 uVar22;
  int iVar23;
  size_t copy_length;
  char *p;
  char buff [512];
  size_t local_258;
  char *local_250;
  char *local_248;
  la_int64_t *local_240;
  archive_string local_238 [4];
  byte abStack_1cf [9];
  undefined1 auStack_1c6 [6];
  undefined2 local_1c0;
  undefined1 auStack_1be [9];
  undefined4 uStack_1b5;
  undefined8 uStack_1b1;
  undefined4 uStack_1a9;
  undefined1 auStack_1a5 [9];
  undefined1 local_19c;
  undefined1 auStack_19b [363];
  
  plVar1 = (la_int64_t *)a->format_data;
  paVar8 = (archive_string_conv *)plVar1[2];
  if (paVar8 == (archive_string_conv *)0x0) {
    if ((int)plVar1[4] == 0) {
      paVar8 = archive_string_default_conversion_for_write(&a->archive);
      plVar1[3] = (la_int64_t)paVar8;
      *(undefined4 *)(plVar1 + 4) = 1;
    }
    paVar8 = (archive_string_conv *)plVar1[3];
  }
  pcVar9 = archive_entry_pathname(entry);
  if (pcVar9 == (char *)0x0) {
    archive_set_error(&a->archive,-1,"Can\'t record entry in tar file without pathname");
    return -0x19;
  }
  pcVar9 = archive_entry_hardlink(entry);
  if (((pcVar9 != (char *)0x0) || (pcVar9 = archive_entry_symlink(entry), pcVar9 != (char *)0x0)) ||
     (mVar5 = archive_entry_filetype(entry), mVar5 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar5 = archive_entry_filetype(entry);
  local_240 = plVar1;
  if (((mVar5 == 0x4000) && (pcVar9 = archive_entry_pathname(entry), pcVar9 != (char *)0x0)) &&
     (sVar10 = strlen(pcVar9), pcVar9[sVar10 - 1] != '/')) {
    local_238[0].s = (char *)0x0;
    local_238[0].length = 0;
    local_238[0].buffer_length = 0;
    sVar10 = strlen(pcVar9);
    paVar11 = archive_string_ensure(local_238,sVar10 + 2);
    if (paVar11 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate v7tar data");
    }
    else {
      local_238[0].length = 0;
      archive_strncat(local_238,pcVar9,sVar10);
      archive_strappend_char(local_238,'/');
      archive_entry_copy_pathname(entry,local_238[0].s);
    }
    archive_string_free(local_238);
    if (paVar11 == (archive_string *)0x0) {
      return -0x1e;
    }
  }
  memcpy(local_238,"",0x200);
  wVar6 = _archive_entry_pathname_l(entry,&local_248,&local_258,paVar8);
  if (wVar6 != L'\0') {
    piVar12 = __errno_location();
    pcVar9 = local_248;
    if (*piVar12 != 0xc) {
      pcVar13 = archive_string_conversion_charset_name(paVar8);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar9,pcVar13);
      iVar23 = -0x14;
      goto LAB_004af087;
    }
    pcVar9 = "Can\'t allocate memory for Pathname";
LAB_004af25a:
    archive_set_error(&a->archive,0xc,pcVar9);
    iVar23 = -0x1e;
    goto LAB_004af4ae;
  }
  iVar23 = 0;
LAB_004af087:
  if (local_258 < 100) {
    memcpy(local_238,local_248,local_258);
  }
  else {
    archive_set_error(&a->archive,0x24,"Pathname too long");
    iVar23 = -0x19;
  }
  wVar6 = _archive_entry_hardlink_l(entry,&local_250,&local_258,paVar8);
  if (wVar6 != L'\0') {
    piVar12 = __errno_location();
    pcVar9 = local_250;
    if (*piVar12 != 0xc) {
      pcVar13 = archive_string_conversion_charset_name(paVar8);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar9,pcVar13);
      iVar23 = -0x14;
      goto LAB_004af112;
    }
LAB_004af253:
    pcVar9 = "Can\'t allocate memory for Linkname";
    goto LAB_004af25a;
  }
LAB_004af112:
  sVar2 = local_258;
  uVar22 = 0x31;
  if (local_258 == 0) {
    wVar6 = _archive_entry_symlink_l(entry,&local_250,&local_258,paVar8);
    uVar22 = 0xff;
    if (wVar6 != L'\0') {
      piVar12 = __errno_location();
      pcVar9 = local_250;
      if (*piVar12 == 0xc) goto LAB_004af253;
      pcVar13 = archive_string_conversion_charset_name(paVar8);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar9,pcVar13);
      iVar23 = -0x14;
    }
  }
  if (local_258 != 0) {
    if (99 < local_258) {
      archive_set_error(&a->archive,0x24,"Link contents too long");
      local_258 = 100;
      iVar23 = -0x19;
    }
    memcpy(auStack_19b,local_250,local_258);
  }
  mVar5 = archive_entry_mode(entry);
  uVar20 = 7;
  uVar14 = (ulong)(mVar5 & 0xfff);
  puVar3 = (undefined4 *)((long)abStack_1cf + 1);
  do {
    puVar17 = puVar3;
    uVar15 = uVar14;
    *(byte *)((long)puVar17 + -1) = (byte)uVar15 & 7 | 0x30;
    uVar20 = uVar20 - 1;
    uVar14 = uVar15 >> 3;
    puVar3 = (undefined4 *)((long)puVar17 + -1);
  } while (1 < uVar20);
  if (7 < uVar15) {
    *(undefined2 *)((long)puVar17 + 3) = 0x3737;
    *(undefined4 *)((long)puVar17 + -1) = 0x37373737;
    archive_set_error(&a->archive,0x22,"Numeric mode too large");
    iVar23 = -0x19;
  }
  uVar14 = archive_entry_uid(entry);
  if ((long)uVar14 < 0) {
    abStack_1cf[7] = 0x30;
    abStack_1cf[8] = 0x30;
    abStack_1cf[3] = 0x30;
    abStack_1cf[4] = 0x30;
    abStack_1cf[5] = 0x30;
    abStack_1cf[6] = 0x30;
LAB_004af289:
    archive_set_error(&a->archive,0x22,"Numeric user ID too large");
    iVar23 = -0x19;
  }
  else {
    uVar20 = 7;
    puVar3 = (undefined4 *)auStack_1c6;
    do {
      puVar17 = puVar3;
      uVar15 = uVar14;
      *(byte *)((long)puVar17 + -1) = (byte)uVar15 & 7 | 0x30;
      uVar20 = uVar20 - 1;
      uVar14 = uVar15 >> 3;
      puVar3 = (undefined4 *)((long)puVar17 + -1);
    } while (1 < uVar20);
    if (7 < uVar15) {
      *(undefined2 *)((long)puVar17 + 3) = 0x3737;
      *(undefined4 *)((long)puVar17 + -1) = 0x37373737;
      goto LAB_004af289;
    }
  }
  uVar14 = archive_entry_gid(entry);
  if ((long)uVar14 < 0) {
    local_1c0 = 0x3030;
    auStack_1c6._2_4_ = 0x30303030;
LAB_004af307:
    archive_set_error(&a->archive,0x22,"Numeric group ID too large");
    iVar23 = -0x19;
  }
  else {
    uVar20 = 7;
    puVar3 = (undefined4 *)auStack_1be;
    do {
      puVar17 = puVar3;
      uVar15 = uVar14;
      *(byte *)((long)puVar17 + -1) = (byte)uVar15 & 7 | 0x30;
      uVar20 = uVar20 - 1;
      uVar14 = uVar15 >> 3;
      puVar3 = (undefined4 *)((long)puVar17 + -1);
    } while (1 < uVar20);
    if (7 < uVar15) {
      *(undefined2 *)((long)puVar17 + 3) = 0x3737;
      *(undefined4 *)((long)puVar17 + -1) = 0x37373737;
      goto LAB_004af307;
    }
  }
  uVar14 = archive_entry_size(entry);
  if ((long)uVar14 < 0) {
    auStack_1be._2_7_ = 0x30303030303030;
    uStack_1b5 = 0x30303030;
LAB_004af395:
    archive_set_error(&a->archive,0x22,"File size out of range");
    iVar23 = -0x19;
  }
  else {
    uVar20 = 0xc;
    puVar4 = &uStack_1b1;
    do {
      puVar19 = puVar4;
      uVar15 = uVar14;
      *(byte *)((long)puVar19 + -1) = (byte)uVar15 & 7 | 0x30;
      uVar20 = uVar20 - 1;
      uVar14 = uVar15 >> 3;
      puVar4 = (undefined8 *)((long)puVar19 + -1);
    } while (1 < uVar20);
    if (7 < uVar15) {
      *(undefined8 *)((long)puVar19 + -1) = 0x3737373737373737;
      *(undefined4 *)((long)puVar19 + 6) = 0x37373737;
      goto LAB_004af395;
    }
  }
  uVar14 = archive_entry_mtime(entry);
  if ((long)uVar14 < 0) {
    uStack_1b1._1_7_ = 0x30303030303030;
    uStack_1a9 = 0x30303030;
LAB_004af423:
    archive_set_error(&a->archive,0x22,"File modification time too large");
    iVar23 = -0x19;
  }
  else {
    uVar20 = 0xc;
    puVar4 = (undefined8 *)auStack_1a5;
    do {
      puVar19 = puVar4;
      uVar15 = uVar14;
      *(byte *)((long)puVar19 + -1) = (byte)uVar15 & 7 | 0x30;
      uVar20 = uVar20 - 1;
      uVar14 = uVar15 >> 3;
      puVar4 = (undefined8 *)((long)puVar19 + -1);
    } while (1 < uVar20);
    if (7 < uVar15) {
      *(undefined8 *)((long)puVar19 + -1) = 0x3737373737373737;
      *(undefined4 *)((long)puVar19 + 6) = 0x37373737;
      goto LAB_004af423;
    }
  }
  if (sVar2 != 0) {
    local_19c = uVar22;
    goto switchD_004af52b_caseD_3;
  }
  mVar5 = archive_entry_filetype(entry);
  switch(mVar5 << 0x14 | mVar5 - 0x1000 >> 0xc) {
  case 0:
    pcVar9 = "tar format cannot archive fifo";
    break;
  case 1:
    pcVar9 = "tar format cannot archive character device";
    break;
  default:
    archive_entry_mode(entry);
    archive_set_error(&a->archive,0x54,"tar format cannot archive this (mode=0%lo)");
    iVar23 = -0x19;
  case 3:
  case 7:
    goto switchD_004af52b_caseD_3;
  case 5:
    pcVar9 = "tar format cannot archive block device";
    break;
  case 9:
    local_19c = 0x32;
    goto switchD_004af52b_caseD_3;
  case 0xb:
    pcVar9 = "tar format cannot archive socket";
  }
  archive_set_error(&a->archive,0x54,pcVar9);
  iVar23 = -0x19;
LAB_004af4ae:
  iVar7 = iVar23;
  if ((-0x15 < iVar23) && (iVar7 = __archive_write_output(a,local_238,0x200), -0x15 < iVar7)) {
    if (iVar23 <= iVar7) {
      iVar7 = iVar23;
    }
    lVar18 = archive_entry_size(entry);
    *local_240 = lVar18;
    local_240[1] = (ulong)(-(int)lVar18 & 0x1ff);
  }
  return iVar7;
switchD_004af52b_caseD_3:
  lVar16 = 0;
  uVar20 = 0;
  do {
    uVar20 = uVar20 + *(byte *)((long)&local_238[0].s + lVar16);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x200);
  uVar21 = 7;
  puVar3 = (undefined4 *)(auStack_1a5 + 7);
  uVar14 = (ulong)uVar20;
  do {
    uVar15 = uVar14;
    puVar17 = puVar3;
    *(byte *)((long)puVar17 + -1) = (byte)uVar15 & 7 | 0x30;
    uVar21 = uVar21 - 1;
    puVar3 = (undefined4 *)((long)puVar17 + -1);
    uVar14 = uVar15 >> 3;
  } while (1 < uVar21);
  if (7 < uVar15) {
    *(undefined2 *)((long)puVar17 + 3) = 0x3737;
    *(undefined4 *)((long)puVar17 + -1) = 0x37373737;
  }
  auStack_1a5[7] = 0;
  goto LAB_004af4ae;
}

Assistant:

static int
archive_write_v7tar_header(struct archive_write *a, struct archive_entry *entry)
{
	char buff[512];
	int ret, ret2;
	struct v7tar *v7tar;
	struct archive_entry *entry_main;
	struct archive_string_conv *sconv;

	v7tar = (struct v7tar *)a->format_data;

	/* Setup default string conversion. */
	if (v7tar->opt_sconv == NULL) {
		if (!v7tar->init_default_conversion) {
			v7tar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			v7tar->init_default_conversion = 1;
		}
		sconv = v7tar->sconv_default;
	} else
		sconv = v7tar->opt_sconv;

	/* Sanity check. */
	if (archive_entry_pathname(entry) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't record entry in tar file without pathname");
		return (ARCHIVE_FAILED);
	}

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate v7tar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	ret = format_header_v7tar(a, buff, entry, 1, sconv);
	if (ret < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret);
	}
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret2);
	}
	if (ret2 < ret)
		ret = ret2;

	v7tar->entry_bytes_remaining = archive_entry_size(entry);
	v7tar->entry_padding = 0x1ff & (-(int64_t)v7tar->entry_bytes_remaining);
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret);
}